

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O2

void connection_fail(uv_connect_cb connect_cb)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_30;
  sockaddr_in server_addr;
  sockaddr_in client_addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0,&client_addr);
  if (iVar1 == 0) {
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&server_addr);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_tcp_init(puVar2,&tcp);
      if (iVar1 == 0) {
        iVar1 = uv_tcp_bind(&tcp,(sockaddr *)&client_addr,0);
        if (iVar1 == 0) {
          iVar1 = uv_tcp_connect(&req,&tcp,(sockaddr *)&server_addr,connect_cb);
          if (iVar1 == 0) {
            puVar2 = uv_default_loop();
            uv_run(puVar2,UV_RUN_DEFAULT);
            if (connect_cb_calls == 1) {
              if (close_cb_calls == 1) {
                return;
              }
              pcVar3 = "close_cb_calls == 1";
              uStack_30 = 0x72;
            }
            else {
              pcVar3 = "connect_cb_calls == 1";
              uStack_30 = 0x71;
            }
          }
          else {
            pcVar3 = "!r";
            uStack_30 = 0x6d;
          }
        }
        else {
          pcVar3 = "0 == uv_tcp_bind(&tcp, (const struct sockaddr*) &client_addr, 0)";
          uStack_30 = 0x67;
        }
      }
      else {
        pcVar3 = "!r";
        uStack_30 = 99;
      }
    }
    else {
      pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &server_addr)";
      uStack_30 = 0x5f;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"0.0.0.0\", 0, &client_addr)";
    uStack_30 = 0x5c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
          ,uStack_30,pcVar3);
  abort();
}

Assistant:

static void connection_fail(uv_connect_cb connect_cb) {
  struct sockaddr_in client_addr, server_addr;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", 0, &client_addr));

  /* There should be no servers listening on this port. */
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &server_addr));

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &tcp);
  ASSERT(!r);

  /* We are never doing multiple reads/connects at a time anyway. so these
   * handles can be pre-initialized. */
  ASSERT(0 == uv_tcp_bind(&tcp, (const struct sockaddr*) &client_addr, 0));

  r = uv_tcp_connect(&req,
                     &tcp,
                     (const struct sockaddr*) &server_addr,
                     connect_cb);
  ASSERT(!r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(connect_cb_calls == 1);
  ASSERT(close_cb_calls == 1);
}